

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_gnutar.c
# Opt level: O1

int archive_write_gnutar_header(archive_write *a,archive_entry *entry)

{
  char **p;
  size_t *len;
  la_int64_t *plVar1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  mode_t mVar5;
  wchar_t wVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  archive_string_conv *paVar10;
  char *pcVar11;
  size_t sVar12;
  archive_string *paVar13;
  int *piVar14;
  char *pcVar15;
  archive_entry *paVar16;
  la_int64_t lVar17;
  int iVar18;
  char buff [512];
  archive_string local_238 [21];
  
  plVar1 = (la_int64_t *)a->format_data;
  paVar10 = (archive_string_conv *)plVar1[10];
  if (paVar10 == (archive_string_conv *)0x0) {
    if ((int)plVar1[0xc] == 0) {
      paVar10 = archive_string_default_conversion_for_write(&a->archive);
      plVar1[0xb] = (la_int64_t)paVar10;
      *(undefined4 *)(plVar1 + 0xc) = 1;
    }
    paVar10 = (archive_string_conv *)plVar1[0xb];
  }
  pcVar11 = archive_entry_hardlink(entry);
  if (((pcVar11 != (char *)0x0) || (pcVar11 = archive_entry_symlink(entry), pcVar11 != (char *)0x0))
     || (mVar5 = archive_entry_filetype(entry), mVar5 != 0x8000)) {
    archive_entry_set_size(entry,0);
  }
  mVar5 = archive_entry_filetype(entry);
  if (((mVar5 == 0x4000) && (pcVar11 = archive_entry_pathname(entry), pcVar11 != (char *)0x0)) &&
     ((*pcVar11 != '\0' && (sVar12 = strlen(pcVar11), pcVar11[sVar12 - 1] != '/')))) {
    local_238[0].s = (char *)0x0;
    local_238[0].length = 0;
    local_238[0].buffer_length = 0;
    sVar12 = strlen(pcVar11);
    paVar13 = archive_string_ensure(local_238,sVar12 + 2);
    if (paVar13 == (archive_string *)0x0) {
      archive_set_error(&a->archive,0xc,"Can\'t allocate ustar data");
    }
    else {
      local_238[0].length = 0;
      archive_strncat(local_238,pcVar11,sVar12);
      archive_strappend_char(local_238,'/');
      archive_entry_copy_pathname(entry,local_238[0].s);
    }
    archive_string_free(local_238);
    if (paVar13 == (archive_string *)0x0) {
      return -0x1e;
    }
  }
  wVar6 = _archive_entry_pathname_l(entry,(char **)(plVar1 + 4),(size_t *)(plVar1 + 5),paVar10);
  if (wVar6 == L'\0') {
    iVar18 = 0;
LAB_0016cdf5:
    wVar6 = _archive_entry_uname_l(entry,(char **)(plVar1 + 6),(size_t *)(plVar1 + 7),paVar10);
    if (wVar6 != L'\0') {
      piVar14 = __errno_location();
      if (*piVar14 == 0xc) {
        pcVar11 = "Can\'t allocate memory for Uname";
        goto LAB_0016cfec;
      }
      pcVar11 = archive_entry_uname(entry);
      pcVar15 = archive_string_conversion_charset_name(paVar10);
      archive_set_error(&a->archive,0x54,"Can\'t translate uname \'%s\' to %s",pcVar11,pcVar15);
      iVar18 = -0x14;
    }
    wVar6 = _archive_entry_gname_l(entry,(char **)(plVar1 + 8),(size_t *)(plVar1 + 9),paVar10);
    if (wVar6 != L'\0') {
      piVar14 = __errno_location();
      if (*piVar14 == 0xc) {
        pcVar11 = "Can\'t allocate memory for Gname";
        goto LAB_0016cfec;
      }
      pcVar11 = archive_entry_gname(entry);
      pcVar15 = archive_string_conversion_charset_name(paVar10);
      archive_set_error(&a->archive,0x54,"Can\'t translate gname \'%s\' to %s",pcVar11,pcVar15);
      iVar18 = -0x14;
    }
    p = (char **)(plVar1 + 2);
    len = (size_t *)(plVar1 + 3);
    wVar6 = _archive_entry_hardlink_l(entry,p,len,paVar10);
    if (wVar6 == L'\0') {
LAB_0016cf26:
      if ((*len == 0) && (wVar6 = _archive_entry_symlink_l(entry,p,len,paVar10), wVar6 != L'\0')) {
        piVar14 = __errno_location();
        if (*piVar14 == 0xc) goto LAB_0016cfe5;
        pcVar11 = archive_entry_hardlink(entry);
        pcVar15 = archive_string_conversion_charset_name(paVar10);
        archive_set_error(&a->archive,0x54,"Can\'t translate linkname \'%s\' to %s",pcVar11,pcVar15)
        ;
        iVar18 = -0x14;
      }
      uVar2 = *len;
      if (100 < uVar2) {
        paVar16 = archive_entry_new2(&a->archive);
        archive_entry_set_uname(paVar16,"root");
        archive_entry_set_gname(paVar16,"wheel");
        archive_entry_set_pathname(paVar16,"././@LongLink");
        archive_entry_set_size(paVar16,uVar2 + 1);
        iVar7 = archive_format_gnutar_header(a,(char *)local_238,paVar16,0x4b);
        archive_entry_free(paVar16);
        if (iVar7 < -0x14) {
          bVar3 = false;
        }
        else {
          iVar7 = __archive_write_output(a,local_238,0x200);
          if ((iVar7 < -0x14) || (iVar7 = __archive_write_output(a,*p,uVar2 + 1), iVar7 < -0x14)) {
            bVar3 = false;
          }
          else {
            iVar7 = __archive_write_nulls(a,(ulong)(~(uint)uVar2 & 0x1ff));
            bVar3 = -0x15 < iVar7;
          }
        }
        if (!bVar3) goto LAB_0016d000;
      }
      uVar2 = plVar1[5];
      if (100 < uVar2) {
        pcVar11 = (char *)plVar1[4];
        paVar16 = archive_entry_new2(&a->archive);
        archive_entry_set_uname(paVar16,"root");
        archive_entry_set_gname(paVar16,"wheel");
        archive_entry_set_pathname(paVar16,"././@LongLink");
        archive_entry_set_size(paVar16,uVar2 + 1);
        iVar7 = archive_format_gnutar_header(a,(char *)local_238,paVar16,0x4c);
        archive_entry_free(paVar16);
        if (iVar7 < -0x14) {
          bVar3 = false;
        }
        else {
          iVar7 = __archive_write_output(a,local_238,0x200);
          if ((iVar7 < -0x14) ||
             (iVar7 = __archive_write_output(a,pcVar11,uVar2 + 1), iVar7 < -0x14)) {
            bVar3 = false;
          }
          else {
            iVar7 = __archive_write_nulls(a,(ulong)(~(uint)uVar2 & 0x1ff));
            bVar3 = -0x15 < iVar7;
          }
        }
        if (!bVar3) goto LAB_0016d000;
      }
      pcVar11 = archive_entry_hardlink(entry);
      iVar7 = 0x31;
      if (pcVar11 == (char *)0x0) {
        mVar5 = archive_entry_filetype(entry);
        uVar4 = mVar5 - 0x1000 >> 0xc;
        uVar9 = mVar5 << 0x14 | uVar4;
        if ((9 < uVar9) || ((0x2abU >> (uVar4 & 0x1f) & 1) == 0)) {
          __archive_write_entry_filetype_unsupported(&a->archive,entry,"gnutar");
          iVar7 = -0x19;
          goto LAB_0016d000;
        }
        iVar7 = *(int *)(&DAT_00272460 + (ulong)uVar9 * 4);
      }
      iVar8 = archive_format_gnutar_header(a,(char *)local_238,entry,iVar7);
      iVar7 = iVar8;
      if ((-0x15 < iVar8) && (iVar7 = __archive_write_output(a,local_238,0x200), -0x15 < iVar7)) {
        if (iVar18 < iVar8) {
          iVar8 = iVar18;
        }
        if (iVar7 < iVar8) {
          iVar8 = iVar7;
        }
        iVar7 = iVar8;
        lVar17 = archive_entry_size(entry);
        *plVar1 = lVar17;
        plVar1[1] = (ulong)(-(int)lVar17 & 0x1ff);
      }
      goto LAB_0016d000;
    }
    piVar14 = __errno_location();
    if (*piVar14 != 0xc) {
      pcVar11 = archive_entry_hardlink(entry);
      pcVar15 = archive_string_conversion_charset_name(paVar10);
      archive_set_error(&a->archive,0x54,"Can\'t translate linkname \'%s\' to %s",pcVar11,pcVar15);
      iVar18 = -0x14;
      goto LAB_0016cf26;
    }
LAB_0016cfe5:
    pcVar11 = "Can\'t allocate memory for Linkname";
  }
  else {
    piVar14 = __errno_location();
    if (*piVar14 != 0xc) {
      pcVar11 = archive_entry_pathname(entry);
      pcVar15 = archive_string_conversion_charset_name(paVar10);
      archive_set_error(&a->archive,0x54,"Can\'t translate pathname \'%s\' to %s",pcVar11,pcVar15);
      iVar18 = -0x14;
      goto LAB_0016cdf5;
    }
    pcVar11 = "Can\'t allocate memory for Pathame";
  }
LAB_0016cfec:
  archive_set_error(&a->archive,0xc,pcVar11);
  iVar7 = -0x1e;
LAB_0016d000:
  archive_entry_free((archive_entry *)0x0);
  return iVar7;
}

Assistant:

static int
archive_write_gnutar_header(struct archive_write *a,
     struct archive_entry *entry)
{
	char buff[512];
	int r, ret, ret2 = ARCHIVE_OK;
	int tartype;
	struct gnutar *gnutar;
	struct archive_string_conv *sconv;
	struct archive_entry *entry_main;

	gnutar = (struct gnutar *)a->format_data;

	/* Setup default string conversion. */
	if (gnutar->opt_sconv == NULL) {
		if (!gnutar->init_default_conversion) {
			gnutar->sconv_default =
			    archive_string_default_conversion_for_write(
				&(a->archive));
			gnutar->init_default_conversion = 1;
		}
		sconv = gnutar->sconv_default;
	} else
		sconv = gnutar->opt_sconv;

	/* Only regular files (not hardlinks) have data. */
	if (archive_entry_hardlink(entry) != NULL ||
	    archive_entry_symlink(entry) != NULL ||
	    !(archive_entry_filetype(entry) == AE_IFREG))
		archive_entry_set_size(entry, 0);

	if (AE_IFDIR == archive_entry_filetype(entry)) {
		const char *p;
		size_t path_length;
		/*
		 * Ensure a trailing '/'.  Modify the entry so
		 * the client sees the change.
		 */
#if defined(_WIN32) && !defined(__CYGWIN__)
		const wchar_t *wp;

		wp = archive_entry_pathname_w(entry);
		if (wp != NULL && wp[wcslen(wp) -1] != L'/') {
			struct archive_wstring ws;

			archive_string_init(&ws);
			path_length = wcslen(wp);
			if (archive_wstring_ensure(&ws,
			    path_length + 2) == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate ustar data");
				archive_wstring_free(&ws);
				return(ARCHIVE_FATAL);
			}
			/* Should we keep '\' ? */
			if (wp[path_length -1] == L'\\')
				path_length--;
			archive_wstrncpy(&ws, wp, path_length);
			archive_wstrappend_wchar(&ws, L'/');
			archive_entry_copy_pathname_w(entry, ws.s);
			archive_wstring_free(&ws);
			p = NULL;
		} else
#endif
			p = archive_entry_pathname(entry);
		/*
		 * On Windows, this is a backup operation just in
		 * case getting WCS failed. On POSIX, this is a
		 * normal operation.
		 */
		if (p != NULL && p[0] != '\0' && p[strlen(p) - 1] != '/') {
			struct archive_string as;

			archive_string_init(&as);
			path_length = strlen(p);
			if (archive_string_ensure(&as,
			    path_length + 2) == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate ustar data");
				archive_string_free(&as);
				return(ARCHIVE_FATAL);
			}
#if defined(_WIN32) && !defined(__CYGWIN__)
			/* NOTE: This might break the pathname
			 * if the current code page is CP932 and
			 * the pathname includes a character '\'
			 * as a part of its multibyte pathname. */
			if (p[strlen(p) -1] == '\\')
				path_length--;
			else
#endif
			archive_strncpy(&as, p, path_length);
			archive_strappend_char(&as, '/');
			archive_entry_copy_pathname(entry, as.s);
			archive_string_free(&as);
		}
	}

#if defined(_WIN32) && !defined(__CYGWIN__)
	/* Make sure the path separators in pathname, hardlink and symlink
	 * are all slash '/', not the Windows path separator '\'. */
	entry_main = __la_win_entry_in_posix_pathseparator(entry);
	if (entry_main == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate ustar data");
		return(ARCHIVE_FATAL);
	}
	if (entry != entry_main)
		entry = entry_main;
	else
		entry_main = NULL;
#else
	entry_main = NULL;
#endif
	r = archive_entry_pathname_l(entry, &(gnutar->pathname),
	    &(gnutar->pathname_length), sconv);
	if (r != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Pathame");
			ret = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't translate pathname '%s' to %s",
		    archive_entry_pathname(entry),
		    archive_string_conversion_charset_name(sconv));
		ret2 = ARCHIVE_WARN;
	}
	r = archive_entry_uname_l(entry, &(gnutar->uname),
	    &(gnutar->uname_length), sconv);
	if (r != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Uname");
			ret = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't translate uname '%s' to %s",
		    archive_entry_uname(entry),
		    archive_string_conversion_charset_name(sconv));
		ret2 = ARCHIVE_WARN;
	}
	r = archive_entry_gname_l(entry, &(gnutar->gname),
	    &(gnutar->gname_length), sconv);
	if (r != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Gname");
			ret = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't translate gname '%s' to %s",
		    archive_entry_gname(entry),
		    archive_string_conversion_charset_name(sconv));
		ret2 = ARCHIVE_WARN;
	}

	/* If linkname is longer than 100 chars we need to add a 'K' header. */
	r = archive_entry_hardlink_l(entry, &(gnutar->linkname),
	    &(gnutar->linkname_length), sconv);
	if (r != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Linkname");
			ret = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't translate linkname '%s' to %s",
		    archive_entry_hardlink(entry),
		    archive_string_conversion_charset_name(sconv));
		ret2 = ARCHIVE_WARN;
	}
	if (gnutar->linkname_length == 0) {
		r = archive_entry_symlink_l(entry, &(gnutar->linkname),
		    &(gnutar->linkname_length), sconv);
		if (r != 0) {
			if (errno == ENOMEM) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory for Linkname");
				ret = ARCHIVE_FATAL;
				goto exit_write_header;
			}
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Can't translate linkname '%s' to %s",
			    archive_entry_hardlink(entry),
			    archive_string_conversion_charset_name(sconv));
			ret2 = ARCHIVE_WARN;
		}
	}
	if (gnutar->linkname_length > GNUTAR_linkname_size) {
		size_t length = gnutar->linkname_length + 1;
		struct archive_entry *temp = archive_entry_new2(&a->archive);

		/* Uname/gname here don't really matter since no one reads them;
		 * these are the values that GNU tar happens to use on FreeBSD. */
		archive_entry_set_uname(temp, "root");
		archive_entry_set_gname(temp, "wheel");

		archive_entry_set_pathname(temp, "././@LongLink");
		archive_entry_set_size(temp, length);
		ret = archive_format_gnutar_header(a, buff, temp, 'K');
		archive_entry_free(temp);
		if (ret < ARCHIVE_WARN)
			goto exit_write_header;
		ret = __archive_write_output(a, buff, 512);
		if (ret < ARCHIVE_WARN)
			goto exit_write_header;
		/* Write name and trailing null byte. */
		ret = __archive_write_output(a, gnutar->linkname, length);
		if (ret < ARCHIVE_WARN)
			goto exit_write_header;
		/* Pad to 512 bytes */
		ret = __archive_write_nulls(a, 0x1ff & (-(ssize_t)length));
		if (ret < ARCHIVE_WARN)
			goto exit_write_header;
	}

	/* If pathname is longer than 100 chars we need to add an 'L' header. */
	if (gnutar->pathname_length > GNUTAR_name_size) {
		const char *pathname = gnutar->pathname;
		size_t length = gnutar->pathname_length + 1;
		struct archive_entry *temp = archive_entry_new2(&a->archive);

		/* Uname/gname here don't really matter since no one reads them;
		 * these are the values that GNU tar happens to use on FreeBSD. */
		archive_entry_set_uname(temp, "root");
		archive_entry_set_gname(temp, "wheel");

		archive_entry_set_pathname(temp, "././@LongLink");
		archive_entry_set_size(temp, length);
		ret = archive_format_gnutar_header(a, buff, temp, 'L');
		archive_entry_free(temp);
		if (ret < ARCHIVE_WARN)
			goto exit_write_header;
		ret = __archive_write_output(a, buff, 512);
		if(ret < ARCHIVE_WARN)
			goto exit_write_header;
		/* Write pathname + trailing null byte. */
		ret = __archive_write_output(a, pathname, length);
		if(ret < ARCHIVE_WARN)
			goto exit_write_header;
		/* Pad to multiple of 512 bytes. */
		ret = __archive_write_nulls(a, 0x1ff & (-(ssize_t)length));
		if (ret < ARCHIVE_WARN)
			goto exit_write_header;
	}

	if (archive_entry_hardlink(entry) != NULL) {
		tartype = '1';
	} else
		switch (archive_entry_filetype(entry)) {
		case AE_IFREG: tartype = '0' ; break;
		case AE_IFLNK: tartype = '2' ; break;
		case AE_IFCHR: tartype = '3' ; break;
		case AE_IFBLK: tartype = '4' ; break;
		case AE_IFDIR: tartype = '5' ; break;
		case AE_IFIFO: tartype = '6' ; break;
		default: /* AE_IFSOCK and unknown */
			__archive_write_entry_filetype_unsupported(
                            &a->archive, entry, "gnutar");
			ret = ARCHIVE_FAILED;
			goto exit_write_header;
		}

	ret = archive_format_gnutar_header(a, buff, entry, tartype);
	if (ret < ARCHIVE_WARN)
		goto exit_write_header;
	if (ret2 < ret)
		ret = ret2;
	ret2 = __archive_write_output(a, buff, 512);
	if (ret2 < ARCHIVE_WARN) {
		ret = ret2;
		goto exit_write_header;
	}
	if (ret2 < ret)
		ret = ret2;

	gnutar->entry_bytes_remaining = archive_entry_size(entry);
	gnutar->entry_padding = 0x1ff & (-(int64_t)gnutar->entry_bytes_remaining);
exit_write_header:
	archive_entry_free(entry_main);
	return (ret);
}